

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O1

void highwayhash::MeasureDurations(Func func,DurationsForInputs *input_map,uint8_t *arg)

{
  FuncInput FVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  Item *pIVar4;
  float fVar5;
  uint resolution;
  pointer puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Duration DVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var14;
  _Rb_tree_node_base *p_Var15;
  float **ppfVar16;
  size_t sVar17;
  unsigned_long uVar18;
  pointer puVar19;
  ulong uVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distribution;
  Inputs inputs;
  DurationSamples samples;
  DurationSamples samples_1;
  mt19937_64 rng;
  mt19937_64 *in_stack_fffffffffffff518;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_ac0;
  undefined1 local_aa8 [24];
  pointer local_a90;
  iterator iStack_a88;
  unsigned_long *local_a80;
  ulong local_a78;
  ulong local_a70;
  DurationSamples local_a68;
  DurationSamples local_a30;
  mt19937_64 local_9f8;
  
  local_9f8._M_x[0] = 0x1571;
  lVar12 = 1;
  uVar18 = 0x1571;
  do {
    uVar18 = (uVar18 >> 0x3e ^ uVar18) * 0x5851f42d4c957f2d + lVar12;
    local_9f8._M_x[lVar12] = uVar18;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x138);
  local_9f8._M_p = 0x138;
  if (((anonymous_namespace)::
       Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution ==
       '\0') &&
     (iVar11 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                                    ::resolution), iVar11 != 0)) {
    (anonymous_namespace)::
    Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution =
         anon_unknown_0::EstimateResolution(func,arg);
    __cxa_guard_release(&(anonymous_namespace)::
                         Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                         ::resolution);
  }
  resolution = (anonymous_namespace)::
               Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::
               resolution;
  uVar20 = (ulong)(anonymous_namespace)::
                  Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::
                  resolution;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_ac0,input_map->inputs_,
             input_map->inputs_ + input_map->num_inputs_,(allocator_type *)local_aa8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_aa8,&local_ac0);
  uVar8 = local_aa8._8_8_;
  uVar7 = local_aa8._0_8_;
  if (local_aa8._0_8_ != local_aa8._8_8_) {
    uVar13 = (long)(local_aa8._8_8_ - local_aa8._0_8_) >> 3;
    lVar12 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_aa8._0_8_,local_aa8._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar7,uVar8);
  }
  _Var14 = std::
           __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_aa8._0_8_,local_aa8._8_8_);
  if (_Var14._M_current != (unsigned_long *)local_aa8._8_8_) {
    local_aa8._8_8_ = _Var14;
  }
  uVar20 = ((ulong)((long)local_ac0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * uVar20 * 400;
  local_a90 = (pointer)0x0;
  iStack_a88._M_current = (unsigned_long *)0x0;
  local_a80 = (unsigned_long *)0x0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a90,
               ((long)local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) +
               ((long)iStack_a88._M_current - (long)local_a90 >> 3));
    puVar6 = local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar19 = local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar19 != puVar6;
        puVar19 = puVar19 + 1) {
      local_a68.num_samples_ = *puVar19;
      if (iStack_a88._M_current == local_a80) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a90,iStack_a88,
                   &local_a68.num_samples_);
      }
      else {
        *iStack_a88._M_current = local_a68.num_samples_;
        iStack_a88._M_current = iStack_a88._M_current + 1;
      }
    }
    DVar9 = anon_unknown_0::TotalDuration
                      (resolution,func,arg,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a90,
                       &local_9f8);
  } while (DVar9 <= uVar20 && uVar20 - DVar9 != 0);
  uVar20 = (long)iStack_a88._M_current - (long)local_a90 >> 3;
  uVar13 = (long)local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_a78 = uVar20 / uVar13;
  if (local_a78 != 1) {
    printf("NumReplicas %zu\n",local_a78,uVar20 % uVar13);
  }
  fVar5 = (float)(int)local_a78;
  anon_unknown_0::GatherDurationSamples
            (&local_a68,resolution,(Inputs *)local_aa8,func,arg,(size_t)&local_9f8,
             in_stack_fffffffffffff518);
  for (p_Var15 = local_a68.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 != &local_a68.samples_for_input_._M_t._M_impl.super__Rb_tree_header
      ; p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    FVar1 = *(FuncInput *)(p_Var15 + 1);
    p_Var2 = p_Var15[1]._M_parent;
    p_Var3 = p_Var15[1]._M_left;
    if (p_Var2 != p_Var3) {
      uVar20 = (long)p_Var3 - (long)p_Var2 >> 2;
      lVar12 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3);
    }
    uVar10 = Mode<unsigned_int>(&(p_Var15[1]._M_parent)->_M_color,
                                (long)p_Var15[1]._M_left - (long)p_Var15[1]._M_parent >> 2);
    pIVar4 = input_map->items;
    sVar17 = input_map->num_items;
    pIVar4[sVar17].input = FVar1;
    pIVar4[sVar17].num_durations = 1;
    *pIVar4[sVar17].durations = (float)uVar10 * (1.0 / fVar5);
    input_map->num_items = sVar17 + 1;
  }
  if (1 < input_map->max_durations_) {
    uVar20 = 1;
    do {
      local_a70 = uVar20;
      anon_unknown_0::GatherDurationSamples
                (&local_a30,resolution,(Inputs *)local_aa8,func,arg,(size_t)&local_9f8,
                 in_stack_fffffffffffff518);
      for (p_Var15 = local_a30.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var15 !=
          &local_a30.samples_for_input_._M_t._M_impl.super__Rb_tree_header;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        FVar1 = *(FuncInput *)(p_Var15 + 1);
        p_Var2 = p_Var15[1]._M_parent;
        p_Var3 = p_Var15[1]._M_left;
        if (p_Var2 != p_Var3) {
          uVar20 = (long)p_Var3 - (long)p_Var2 >> 2;
          lVar12 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var2,p_Var3,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var2,p_Var3);
        }
        uVar10 = Mode<unsigned_int>(&(p_Var15[1]._M_parent)->_M_color,
                                    (long)p_Var15[1]._M_left - (long)p_Var15[1]._M_parent >> 2);
        sVar17 = input_map->num_items;
        if (sVar17 != 0) {
          ppfVar16 = &input_map->items->durations;
          do {
            if (((Item *)(ppfVar16 + -2))->input == FVar1) {
              sVar17 = (size_t)ppfVar16[-1];
              (*ppfVar16)[sVar17] = (float)uVar10 * (1.0 / fVar5);
              ppfVar16[-1] = (float *)(sVar17 + 1);
              break;
            }
            ppfVar16 = ppfVar16 + 3;
            sVar17 = sVar17 - 1;
          } while (sVar17 != 0);
        }
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree(&local_a30.samples_for_input_._M_t);
      uVar20 = local_a70 + 1;
    } while (uVar20 < input_map->max_durations_);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&local_a68.samples_for_input_._M_t);
  if (local_a90 != (pointer)0x0) {
    operator_delete(local_a90,(long)local_a80 - (long)local_a90);
  }
  if ((unsigned_long *)local_aa8._0_8_ != (unsigned_long *)0x0) {
    operator_delete((void *)local_aa8._0_8_,local_aa8._16_8_ - local_aa8._0_8_);
  }
  if (local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_ac0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_ac0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ac0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MeasureDurations(const Func func, DurationsForInputs* input_map,
                      const uint8_t* arg) {
  std::mt19937_64 rng;
  const Duration resolution = Resolution(func, arg);

  // Adds enough 'replicas' of the distribution to measure "func" given
  // the timer resolution.
  const std::vector<FuncInput> distribution(
      input_map->inputs_, input_map->inputs_ + input_map->num_inputs_);
  Inputs inputs(resolution, distribution, func, arg, &rng);
  const double per_call = 1.0 / static_cast<int>(inputs.NumReplicas());

  // First iteration: populate input_map items.
  auto samples =
      GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
  samples.Reduce(
      [per_call, input_map](const FuncInput input, const Duration duration) {
        const float sample = static_cast<float>(duration * per_call);
        input_map->AddItem(input, sample);
      });

  // Subsequent iteration(s): append to input_map items' array.
  for (size_t rep = 1; rep < input_map->max_durations_; ++rep) {
    auto samples =
        GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
    samples.Reduce(
        [per_call, input_map](const FuncInput input, const Duration duration) {
          const float sample = static_cast<float>(duration * per_call);
          input_map->AddSample(input, sample);
        });
  }
}